

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

FunctionDefinition * __thiscall ninx::parser::element::Block::get_function(Block *this,string *name)

{
  const_iterator cVar1;
  
  do {
    cVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->functions)._M_h,name);
    if (cVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      cVar1 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->functions)._M_h,name);
      if (cVar1.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        return *(FunctionDefinition **)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>_>,_true>
                       ._M_cur + 0x28);
      }
      std::__throw_out_of_range("_Map_base::at");
    }
    this = (this->super_Expression).super_Statement.super_ASTElement.parent;
  } while (this != (Block *)0x0);
  return (FunctionDefinition *)0x0;
}

Assistant:

ninx::parser::element::FunctionDefinition *ninx::parser::element::Block::get_function(const std::string &name) const {
    if (functions.find(name) != functions.end()) {
        return this->functions.at(name).get();
    }

    // Check if the function is declared in the parent block
    if (this->parent) {
        return this->parent->get_function(name);
    }

    return nullptr;
}